

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

AsinLayerParams * __thiscall
CoreML::Specification::AsinLayerParams::New(AsinLayerParams *this,Arena *arena)

{
  AsinLayerParams *this_00;
  
  this_00 = (AsinLayerParams *)operator_new(0x18);
  AsinLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::AsinLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

AsinLayerParams* AsinLayerParams::New(::google::protobuf::Arena* arena) const {
  AsinLayerParams* n = new AsinLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}